

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  Arena *arena;
  string_view text;
  string_view text_00;
  LocationRecorder value_location;
  LocationRecorder location;
  LocationRecorder local_50;
  LocationRecorder local_38;
  
  if ((undefined1  [80])((undefined1  [80])field->field_0 & (undefined1  [80])0x10) !=
      (undefined1  [80])0x0) {
    RecordError(this,(ErrorMaker)ZEXT816(0x6430c6));
    protobuf::internal::ArenaStringPtr::ClearToEmpty(&(field->field_0)._impl_.json_name_);
    *(byte *)&field->field_0 = *(byte *)&field->field_0 & 0xef;
  }
  LocationRecorder::Init(&local_38,field_location,field_location->source_code_info_);
  RepeatedField<int>::Add(&((local_38.location_)->field_0)._impl_.path_,10);
  LocationRecorder::RecordLegacyLocation(&local_38,&field->super_Message,OPTION_NAME);
  text._M_str = "json_name";
  text._M_len = 9;
  bVar1 = Consume(this,text);
  if (bVar1) {
    text_00._M_str = "=";
    text_00._M_len = 1;
    bVar1 = Consume(this,text_00);
    if (bVar1) {
      LocationRecorder::Init(&local_50,&local_38,local_38.source_code_info_);
      LocationRecorder::RecordLegacyLocation(&local_50,&field->super_Message,OPTION_VALUE);
      *(byte *)&field->field_0 = *(byte *)&field->field_0 | 0x10;
      arena = (Arena *)(field->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      output = protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                         (&(field->field_0)._impl_.json_name_,arena);
      bVar1 = ConsumeString(this,output,(ErrorMaker)ZEXT816(0x6430e6));
      LocationRecorder::~LocationRecorder(&local_50);
      goto LAB_00381cc2;
    }
  }
  bVar1 = false;
LAB_00381cc2:
  LocationRecorder::~LocationRecorder(&local_38);
  return bVar1;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    RecordError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}